

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::addNode(Graph *this)

{
  Node *this_00;
  Node *local_18;
  Node *node;
  Graph *this_local;
  
  node = (Node *)this;
  this_00 = (Node *)operator_new(0x48);
  Node::Node(this_00,this->inserted_nodes);
  local_18 = this_00;
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->adj_list,&local_18);
  this->inserted_nodes = this->inserted_nodes + 1;
  return;
}

Assistant:

void Graph::addNode() {
    // TODO: Modify function (Can fall on duplicate indexes)
    // Possible solution: add a variable that stores the number of total insertions
    Node* node = new Node(inserted_nodes);
    adj_list.push_back(node);
    inserted_nodes++;
}